

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.h
# Opt level: O2

void __thiscall
mvm::
interpreter<mvm::test::test_instr_set_extra,mvm::list::mplist<mvm::meta_bytecode<mvm::bytecode_serializer>,mvm::meta_value_stack<mvm::value_stack<mvm::list::mplist<unsigned_int>>>,mvm::test::meta_double_stack<mvm::value_stack<mvm::list::mplist<double>>>>>
::
produce_unroll<mvm::value_stack<mvm::list::mplist<unsigned_int>>,std::tuple<unsigned_int,unsigned_int>,0ul,1ul>
          (interpreter<mvm::test::test_instr_set_extra,mvm::list::mplist<mvm::meta_bytecode<mvm::bytecode_serializer>,mvm::meta_value_stack<mvm::value_stack<mvm::list::mplist<unsigned_int>>>,mvm::test::meta_double_stack<mvm::value_stack<mvm::list::mplist<double>>>>>
           *this,uint *arg)

{
  value_stack<mvm::list::mplist<unsigned_int>_>::push<unsigned_int>
            ((value_stack<mvm::list::mplist<unsigned_int>_> *)(this + 0x20),arg + 1);
  value_stack<mvm::list::mplist<unsigned_int>_>::push<unsigned_int>
            ((value_stack<mvm::list::mplist<unsigned_int>_> *)(this + 0x20),arg);
  return;
}

Assistant:

void interpreter<Set, InstancesList>::produce_unroll(
    T &&arg, std::index_sequence<Is...>) {

  (std::get<IS>(m_instances)
       .template push<typename std::tuple_element<Is, std::decay_t<T>>::type>(
           std::get<Is>(std::forward<T>(arg))),
   ...);
}